

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-rasterize.c
# Opt level: O0

void plutovg_span_buffer_init_rect
               (plutovg_span_buffer_t *span_buffer,int x,int y,int width,int height)

{
  plutovg_span_t *ppVar1;
  int local_38;
  int local_34;
  int i;
  plutovg_span_t *spans;
  int newcapacity;
  int capacity;
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  plutovg_span_buffer_t *span_buffer_local;
  
  (span_buffer->spans).size = 0;
  if ((span_buffer->spans).capacity < (span_buffer->spans).size + height) {
    if ((span_buffer->spans).capacity == 0) {
      local_38 = 8;
    }
    else {
      local_38 = (span_buffer->spans).capacity;
    }
    for (spans._0_4_ = local_38; (int)spans < (span_buffer->spans).size + height;
        spans._0_4_ = (int)spans << 1) {
    }
    ppVar1 = (plutovg_span_t *)realloc((span_buffer->spans).data,(long)(int)spans << 4);
    (span_buffer->spans).data = ppVar1;
    (span_buffer->spans).capacity = (int)spans;
  }
  ppVar1 = (span_buffer->spans).data;
  for (local_34 = 0; local_34 < height; local_34 = local_34 + 1) {
    ppVar1[local_34].x = x;
    ppVar1[local_34].y = y + local_34;
    ppVar1[local_34].len = width;
    ppVar1[local_34].coverage = 0xff;
  }
  span_buffer->x = x;
  span_buffer->y = y;
  span_buffer->w = width;
  span_buffer->h = height;
  (span_buffer->spans).size = height;
  return;
}

Assistant:

void plutovg_span_buffer_init_rect(plutovg_span_buffer_t* span_buffer, int x, int y, int width, int height)
{
    plutovg_array_clear(span_buffer->spans);
    plutovg_array_ensure(span_buffer->spans, height);
    plutovg_span_t* spans = span_buffer->spans.data;
    for(int i = 0; i < height; i++) {
        spans[i].x = x;
        spans[i].y = y + i;
        spans[i].len = width;
        spans[i].coverage = 255;
    }

    span_buffer->x = x;
    span_buffer->y = y;
    span_buffer->w = width;
    span_buffer->h = height;
    span_buffer->spans.size = height;
}